

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall qpdf::Stream::isRootMetadata(Stream *this)

{
  bool bVar1;
  QPDFObjectHandle local_e0;
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [24];
  QPDFObjectHandle root_metadata;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Stream local_28;
  Stream *local_18;
  Stream *this_local;
  
  local_18 = this;
  getDict(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Metadata",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"/XML",
             (allocator<char> *)
             ((long)&root_metadata.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar1 = QPDFObjectHandle::isDictionaryOfType((QPDFObjectHandle *)&local_28,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root_metadata.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    BaseHandle::qpdf(&this->super_BaseHandle);
    QPDF::getRoot((QPDF *)local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"/Metadata",&local_c9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_a8 + 0x10),(string *)local_a8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a8);
    QPDFObjectHandle::QPDFObjectHandle(&local_e0,(shared_ptr<QPDFObject> *)this);
    this_local._7_1_ =
         QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)(local_a8 + 0x10),&local_e0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_a8 + 0x10));
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
Stream::isRootMetadata() const
{
    if (!getDict().isDictionaryOfType("/Metadata", "/XML")) {
        return false;
    }
    auto root_metadata = qpdf()->getRoot().getKey("/Metadata");
    return root_metadata.isSameObjectAs(obj);
}